

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream&>&>&,kj::None_const&>&,char_const(&)[65]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpOutputStream_&>_&>_&,_const_kj::None_&>
          *params,char (*params_1) [65])

{
  long lVar1;
  undefined8 uVar2;
  char (*params_00) [65];
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  char *local_78;
  size_t local_70;
  ArrayDisposer *pAStack_68;
  String local_60;
  StringPtr local_48;
  char *local_38;
  undefined8 local_30;
  String local_28;
  
  this->exception = (Exception *)0x0;
  local_38 = "(can\'t stringify)";
  local_30 = 0x12;
  local_48.content.ptr = "(can\'t stringify)";
  local_48.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (&local_28,(_ *)&local_38,(StringPtr *)(file + 0x10),&local_48,(StringPtr *)0x12);
  local_78 = local_28.content.ptr;
  local_70 = local_28.content.size_;
  pAStack_68 = local_28.content.disposer;
  str<char_const(&)[65]>
            (&local_60,(kj *)"bug in KJ HTTP: only one HTTP stream wrapper can exist at a time",
             params_00);
  ppcVar4 = &local_78;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      );
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_78 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_70 + lVar3);
      *(undefined8 *)((long)&local_78 + lVar3) = 0;
      *(undefined8 *)((long)&local_70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_68 + lVar3))
                (*(undefined8 **)((long)&pAStack_68 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}